

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O2

uint read_2_bytes(void)

{
  int iVar1;
  int iVar2;
  
  iVar1 = getc((FILE *)infile);
  if (iVar1 != -1) {
    iVar2 = getc((FILE *)infile);
    if (iVar2 != -1) {
      return iVar2 + iVar1 * 0x100;
    }
  }
  fprintf(_stderr,"%s\n","Premature EOF in JPEG file");
  exit(1);
}

Assistant:

static unsigned int
read_2_bytes(void)
{
  int c1, c2;

  c1 = NEXTBYTE();
  if (c1 == EOF)
    ERREXIT("Premature EOF in JPEG file");
  c2 = NEXTBYTE();
  if (c2 == EOF)
    ERREXIT("Premature EOF in JPEG file");
  return (((unsigned int)c1) << 8) + ((unsigned int)c2);
}